

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_search.c
# Opt level: O2

void * ares_dnsrec_convert_arg(ares_callback callback,void *arg)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)ares_malloc_zero(0x10);
  if (puVar1 != (undefined8 *)0x0) {
    *puVar1 = callback;
    puVar1[1] = arg;
  }
  return puVar1;
}

Assistant:

void *ares_dnsrec_convert_arg(ares_callback callback, void *arg)
{
  dnsrec_convert_arg_t *carg = ares_malloc_zero(sizeof(*carg));
  if (carg == NULL) {
    return NULL;
  }
  carg->callback = callback;
  carg->arg      = arg;
  return carg;
}